

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandShowBdd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pObj;
  char *pcVar2;
  Abc_Obj_t *pAStack_38;
  int c;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    iVar1 = Abc_NtkIsBddLogic(pNtk_00);
    if (iVar1 == 0) {
      Abc_Print(-1,"Visualizing BDDs can only be done for logic BDD networks (run \"bdd\").\n");
      return 1;
    }
    if (argc <= globalUtilOptind + 1) {
      if (argc == globalUtilOptind) {
        pObj = Abc_NtkPo(pNtk_00,0);
        pAStack_38 = Abc_ObjFanin0(pObj);
        iVar1 = Abc_ObjIsNode(pAStack_38);
        if (iVar1 == 0) {
          pcVar2 = Abc_ObjName(pAStack_38);
          Abc_Print(-1,"The driver \"%s\" of the first PO is not an internal node.\n",pcVar2);
          return 1;
        }
      }
      else {
        pAStack_38 = Abc_NtkFindNode(pNtk_00,argv[globalUtilOptind]);
        if (pAStack_38 == (Abc_Obj_t *)0x0) {
          Abc_Print(-1,"Cannot find node \"%s\".\n",argv[globalUtilOptind]);
          return 1;
        }
      }
      Abc_NodeShowBdd(pAStack_38);
      return 0;
    }
    Abc_Print(-1,"Wrong number of auguments.\n");
  }
  Abc_Print(-2,"usage: show_bdd [-h] <node>\n");
  Abc_Print(-2,"       visualizes the BDD of a node using DOT and GSVIEW\n");
  Abc_Print(-2,"\t<node>: the node to consider [default = the driver of the first PO]\n");
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandShowBdd( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c;
    extern void Abc_NodeShowBdd( Abc_Obj_t * pNode );

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsBddLogic(pNtk) )
    {
        Abc_Print( -1, "Visualizing BDDs can only be done for logic BDD networks (run \"bdd\").\n" );
        return 1;
    }

    if ( argc > globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }
    if ( argc == globalUtilOptind )
    {
        pNode = Abc_ObjFanin0( Abc_NtkPo(pNtk, 0) );
        if ( !Abc_ObjIsNode(pNode) )
        {
            Abc_Print( -1, "The driver \"%s\" of the first PO is not an internal node.\n", Abc_ObjName(pNode) );
            return 1;
        }
    }
    else
    {
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
        if ( pNode == NULL )
        {
            Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
    }
    Abc_NodeShowBdd( pNode );
    return 0;

usage:
    Abc_Print( -2, "usage: show_bdd [-h] <node>\n" );
    Abc_Print( -2, "       visualizes the BDD of a node using DOT and GSVIEW\n" );
#ifdef WIN32
    Abc_Print( -2, "       \"dot.exe\" and \"gsview32.exe\" should be set in the paths\n" );
    Abc_Print( -2, "       (\"gsview32.exe\" may be in \"C:\\Program Files\\Ghostgum\\gsview\\\")\n" );
#endif
    Abc_Print( -2, "\t<node>: the node to consider [default = the driver of the first PO]\n");
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}